

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

void __thiscall helics::CommonCore::processQueryResponse(CommonCore *this,ActionMessage *message)

{
  ushort uVar1;
  pointer ptVar2;
  byte *pbVar3;
  ActionMessage *pAVar4;
  ActionMessage *pAVar5;
  _Alloc_hider _Var6;
  size_type __n;
  CommonCore *this_00;
  bool bVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  JsonMapBuilder *this_01;
  long lVar11;
  ulong uVar12;
  long lVar13;
  ActionMessage *this_02;
  string str;
  string local_70;
  CommonCore *local_50;
  JsonMapBuilder *local_48;
  ActionMessage *local_40;
  DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_38;
  
  uVar1 = message->counter;
  if (uVar1 == 0) {
    iVar8 = message->messageID;
    pbVar3 = (message->payload).heap;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,pbVar3,pbVar3 + (message->payload).bufferSize);
    gmlc::concurrency::
    DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::setDelayedValue(&this->activeQueries,iVar8,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) {
      return;
    }
  }
  else {
    ptVar2 = (this->mapBuilders).
             super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((((uint)(*(int *)&(this->mapBuilders).
                          super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (int)ptVar2) >> 5) *
         -0x55555555 & 0xffff) <= (uint)uVar1) {
      return;
    }
    uVar12 = (ulong)((uint)uVar1 * 0x60);
    this_01 = (JsonMapBuilder *)
              ((long)&(ptVar2->
                      super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                      ).super__Head_base<0UL,_helics::fileops::JsonMapBuilder,_false>._M_head_impl +
              uVar12);
    pbVar3 = (message->payload).heap;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,pbVar3,pbVar3 + (message->payload).bufferSize);
    local_48 = this_01;
    local_40 = message;
    bVar7 = fileops::JsonMapBuilder::addComponent(this_01,&local_70,message->messageID);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    pAVar4 = local_40;
    if (!bVar7) {
      return;
    }
    fileops::JsonMapBuilder::generate_abi_cxx11_(&local_70,local_48);
    if (pAVar4->counter == 8) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70,0,
                 local_70._M_string_length,"{\"status\":true}",0xf);
    }
    lVar9 = *(long *)((long)&(ptVar2->
                             super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                             ).
                             super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                             .
                             super__Head_base<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_false>
                     + uVar12);
    lVar10 = *(long *)((long)&(ptVar2->
                              super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                              ).
                              super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                              .
                              super__Head_base<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_false>
                      + uVar12 + 8);
    local_50 = this;
    if (1 < (int)((ulong)(lVar10 - lVar9) >> 3) * -0x1642c859) {
      local_38 = &this->activeQueries;
      lVar11 = 0;
      lVar13 = 0;
      do {
        __n = local_70._M_string_length;
        _Var6._M_p = local_70._M_dataplus._M_p;
        if (*(int *)(lVar9 + 0x10 + lVar11) ==
            (local_50->super_BrokerBase).global_broker_id_local.gid) {
          gmlc::concurrency::
          DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::setDelayedValue(local_38,*(int *)(lVar9 + 4 + lVar11),&local_70);
        }
        else {
          if (local_70._M_dataplus._M_p == *(pointer *)(lVar9 + 0x90 + lVar11)) {
            *(size_type *)(lVar9 + 0x80 + lVar11) = local_70._M_string_length;
          }
          else {
            SmallBuffer::reserve((SmallBuffer *)(lVar9 + lVar11 + 0x40),local_70._M_string_length);
            *(size_type *)(lVar9 + 0x80 + lVar11) = __n;
            if (__n != 0) {
              memcpy(*(void **)(lVar9 + 0x90 + lVar11),_Var6._M_p,__n);
            }
          }
          routeMessage(local_50,(ActionMessage *)
                                (*(long *)((long)&(ptVar2->
                                                  super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                                                  ).
                                                  super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                                                  .
                                                  super__Head_base<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_false>
                                          + uVar12) + lVar11));
        }
        lVar13 = lVar13 + 1;
        lVar9 = *(long *)((long)&(ptVar2->
                                 super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                                 ).
                                 super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                                 .
                                 super__Head_base<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_false>
                         + uVar12);
        lVar10 = *(long *)((long)&(ptVar2->
                                  super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                                  ).
                                  super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                                  .
                                  super__Head_base<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_false>
                          + uVar12 + 8);
        lVar11 = lVar11 + 0xb8;
      } while (lVar13 < (int)((ulong)(lVar10 - lVar9) >> 3) * -0x1642c859 + -1);
    }
    this_00 = local_50;
    _Var6._M_p = local_70._M_dataplus._M_p;
    if (*(int *)(lVar10 + -0xa8) == -0x396fe ||
        *(int *)(lVar10 + -0xa8) == (local_50->super_BrokerBase).global_broker_id_local.gid) {
      gmlc::concurrency::
      DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::setDelayedValue(&local_50->activeQueries,*(int *)(lVar10 + -0xb4),&local_70);
    }
    else {
      if (local_70._M_dataplus._M_p == *(pointer *)(lVar10 + -0x28)) {
        *(size_type *)(lVar10 + -0x38) = local_70._M_string_length;
      }
      else {
        SmallBuffer::reserve((SmallBuffer *)(lVar10 + -0x78),local_70._M_string_length);
        *(size_type *)(lVar10 + -0x38) = local_70._M_string_length;
        if (local_70._M_string_length != 0) {
          memcpy(*(void **)(lVar10 + -0x28),_Var6._M_p,local_70._M_string_length);
        }
      }
      routeMessage(this_00,(ActionMessage *)
                           (*(long *)((long)&(ptVar2->
                                             super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                                             ).
                                             super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                                             .
                                             super__Head_base<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_false>
                                     + uVar12 + 8) + -0xb8));
    }
    pAVar4 = *(ActionMessage **)
              ((long)&(ptVar2->
                      super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                      ).
                      super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                      .
                      super__Head_base<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_false>
              + uVar12);
    pAVar5 = *(ActionMessage **)
              ((long)&(ptVar2->
                      super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                      ).
                      super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                      .
                      super__Head_base<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_false>
              + uVar12 + 8);
    this_02 = pAVar4;
    if (pAVar5 != pAVar4) {
      do {
        ActionMessage::~ActionMessage(this_02);
        this_02 = this_02 + 1;
      } while (this_02 != pAVar5);
      *(ActionMessage **)
       ((long)&(ptVar2->
               super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
               ).
               super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
               .
               super__Head_base<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_false>
       + uVar12 + 8) = pAVar4;
    }
    if (*(char *)((long)&(((local_50->mapBuilders).
                           super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                         ).
                         super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                         .super__Tuple_impl<2UL,_helics::QueryReuse> +
                 (ulong)((uint)local_40->counter * 0x60)) == '\x01') {
      fileops::JsonMapBuilder::reset(local_48);
    }
    else {
      iVar8 = generateMapObjectCounter(local_50);
      *(int *)((long)&(ptVar2->
                      super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                      ).super__Head_base<0UL,_helics::fileops::JsonMapBuilder,_false>._M_head_impl +
              uVar12 + 0x38) = iVar8;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) {
      return;
    }
  }
  operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

void CommonCore::processQueryResponse(const ActionMessage& message)
{
    if (message.counter == GENERAL_QUERY) {
        activeQueries.setDelayedValue(message.messageID, std::string(message.payload.to_string()));
        return;
    }
    if (isValidIndex(message.counter, mapBuilders)) {
        auto& builder = std::get<0>(mapBuilders[message.counter]);
        auto& requesters = std::get<1>(mapBuilders[message.counter]);
        if (builder.addComponent(std::string(message.payload.to_string()), message.messageID)) {
            auto str = builder.generate();
            if (message.counter == GLOBAL_FLUSH) {
                str = "{\"status\":true}";
            }
            for (int ii = 0; ii < static_cast<int>(requesters.size()) - 1; ++ii) {
                if (requesters[ii].dest_id == global_broker_id_local) {
                    activeQueries.setDelayedValue(requesters[ii].messageID, str);
                } else {
                    requesters[ii].payload = str;
                    routeMessage(std::move(requesters[ii]));
                }
            }
            if (requesters.back().dest_id == global_broker_id_local ||
                requesters.back().dest_id == gDirectCoreId) {
                activeQueries.setDelayedValue(requesters.back().messageID, std::move(str));
            } else {
                requesters.back().payload = std::move(str);
                routeMessage(std::move(requesters.back()));
            }

            requesters.clear();
            if (std::get<2>(mapBuilders[message.counter]) == QueryReuse::DISABLED) {
                builder.reset();
            } else {
                builder.setCounterCode(generateMapObjectCounter());
            }
        }
    }
}